

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::anon_unknown_1::blendflip<unsigned_char>
               (uchar *src,float weight,uchar *dst,int rowlen,int nchan)

{
  int i;
  uchar *end;
  int nchan_local;
  int rowlen_local;
  uchar *dst_local;
  float weight_local;
  uchar *src_local;
  
  dst_local = dst + (rowlen + -1) * nchan;
  src_local = src;
  while (src_local != src + rowlen * nchan) {
    for (i = 0; i < nchan; i = i + 1) {
      *dst_local = *dst_local + (char)(int)(weight * (float)*src_local);
      dst_local = dst_local + 1;
      src_local = src_local + 1;
    }
    dst_local = dst_local + -(long)(nchan << 1);
  }
  return;
}

Assistant:

inline void blendflip(const T* src, float weight, T* dst, int rowlen, int nchan)
    {
        dst += (rowlen-1) * nchan;
        for (const T* end = src + rowlen * nchan; src != end;) {
            for (int i = 0; i < nchan; i++, dst++) {
                *dst = T(*dst + T(weight * (float)*src++));
            }
            dst -= nchan*2;
        }
    }